

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_617c63::StringSorter::ApplyFilter
          (string *__return_storage_ptr__,StringSorter *this,string *argument)

{
  string *extraout_RAX;
  string *psVar1;
  string *extraout_RAX_00;
  long in_RCX;
  long lVar2;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,argument,(long)&(argument->_M_dataplus)._M_p + in_RCX)
  ;
  lVar2 = 0;
  psVar1 = extraout_RAX;
  do {
    if (*(long *)((long)&this->Filters[0].super__Function_base._M_manager + lVar2) != 0) {
      (**(code **)((long)&this->Filters[0]._M_invoker + lVar2))
                ((string *)local_50,(long)&this->Filters[0].super__Function_base._M_functor + lVar2,
                 __return_storage_ptr__);
      psVar1 = (string *)
               std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
        psVar1 = extraout_RAX_00;
      }
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x40);
  return psVar1;
}

Assistant:

std::string ApplyFilter(const std::string& argument)
  {
    std::string result = argument;
    for (auto const& filter : this->Filters) {
      if (filter != nullptr) {
        result = filter(result);
      }
    }
    return result;
  }